

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::LogicalType,_true> *ret)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined6 in_register_00000032;
  long lVar3;
  LogicalType val;
  pointer local_68;
  pointer pLStack_60;
  pointer local_58;
  pointer local_48;
  element_type *peStack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)uVar1 == '\0') {
    local_38._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48 = (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
    peStack_40 = (element_type *)
                 (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68 = (pointer)0x0;
    pLStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  }
  else {
    local_68 = (pointer)0x0;
    pLStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    iVar2 = (*this->_vptr_Deserializer[8])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    if (lVar3 != 0) {
      do {
        (*this->_vptr_Deserializer[6])(this);
        LogicalType::Deserialize((LogicalType *)&local_48,this);
        (*this->_vptr_Deserializer[7])(this);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalType>
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68,
                   (LogicalType *)&local_48);
        LogicalType::~LogicalType((LogicalType *)&local_48);
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    (*this->_vptr_Deserializer[9])(this);
    local_38._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_58;
    local_48 = (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
    peStack_40 = (element_type *)
                 (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = local_68;
    (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = pLStack_60;
    local_68 = (pointer)0x0;
    pLStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar1 & 0xff));
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}